

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::EndComboPreview(void)

{
  float fVar1;
  int iVar2;
  ImDrawCmd *pIVar3;
  ImDrawCmd *pIVar4;
  ImRect local_40;
  ImVec2 local_30;
  ImDrawList *local_28;
  ImDrawList *draw_list;
  ImGuiComboPreviewData *preview_data;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  window = (ImGuiWindow *)GImGui;
  preview_data = (ImGuiComboPreviewData *)GImGui->CurrentWindow;
  draw_list = (ImDrawList *)&GImGui->ComboPreviewData;
  local_28 = ((ImGuiWindow *)preview_data)->DrawList;
  if ((((((ImGuiWindow *)preview_data)->DC).CursorMaxPos.x <
        (GImGui->ComboPreviewData).PreviewRect.Max.x) &&
      ((((ImGuiWindow *)preview_data)->DC).CursorMaxPos.y <
       (GImGui->ComboPreviewData).PreviewRect.Max.y)) && (1 < (local_28->CmdBuffer).Size)) {
    pIVar3 = ImVector<ImDrawCmd>::operator[](&local_28->CmdBuffer,(local_28->CmdBuffer).Size + -2);
    pIVar4 = ImVector<ImDrawCmd>::operator[](&local_28->CmdBuffer,(local_28->CmdBuffer).Size + -1);
    fVar1 = (pIVar3->ClipRect).y;
    (pIVar4->ClipRect).x = (pIVar3->ClipRect).x;
    (pIVar4->ClipRect).y = fVar1;
    fVar1 = (pIVar3->ClipRect).w;
    (pIVar4->ClipRect).z = (pIVar3->ClipRect).z;
    (pIVar4->ClipRect).w = fVar1;
    fVar1 = (pIVar4->ClipRect).y;
    (local_28->_CmdHeader).ClipRect.x = (pIVar4->ClipRect).x;
    (local_28->_CmdHeader).ClipRect.y = fVar1;
    fVar1 = (pIVar4->ClipRect).w;
    (local_28->_CmdHeader).ClipRect.z = (pIVar4->ClipRect).z;
    (local_28->_CmdHeader).ClipRect.w = fVar1;
    ImDrawList::_TryMergeDrawCmds(local_28);
  }
  PopClipRect();
  iVar2 = (draw_list->IdxBuffer).Capacity;
  preview_data[4].BackupCursorPosPrevLine.x = (float)(draw_list->IdxBuffer).Size;
  preview_data[4].BackupCursorPosPrevLine.y = (float)iVar2;
  local_30 = ImMax(&preview_data[5].PreviewRect.Max,(ImVec2 *)&(draw_list->IdxBuffer).Data);
  preview_data[5].PreviewRect.Max = local_30;
  iVar2 = (draw_list->VtxBuffer).Capacity;
  preview_data[4].BackupPrevLineTextBaseOffset = (float)(draw_list->VtxBuffer).Size;
  preview_data[4].BackupLayout = iVar2;
  preview_data[5].BackupLayout = *(ImGuiLayoutType *)&(draw_list->VtxBuffer).Data;
  preview_data[8].BackupCursorMaxPos.y = *(float *)((long)&(draw_list->VtxBuffer).Data + 4);
  *(undefined1 *)&preview_data[6].PreviewRect.Min.x = 0;
  ImRect::ImRect(&local_40);
  (draw_list->CmdBuffer).Size = (int)local_40.Min.x;
  (draw_list->CmdBuffer).Capacity = (int)local_40.Min.y;
  (draw_list->CmdBuffer).Data = (ImDrawCmd *)local_40.Max;
  return;
}

Assistant:

void ImGui::EndComboPreview()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiComboPreviewData* preview_data = &g.ComboPreviewData;

    // FIXME: Using CursorMaxPos approximation instead of correct AABB which we will store in ImDrawCmd in the future
    ImDrawList* draw_list = window->DrawList;
    if (window->DC.CursorMaxPos.x < preview_data->PreviewRect.Max.x && window->DC.CursorMaxPos.y < preview_data->PreviewRect.Max.y)
        if (draw_list->CmdBuffer.Size > 1) // Unlikely case that the PushClipRect() didn't create a command
        {
            draw_list->_CmdHeader.ClipRect = draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 1].ClipRect = draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 2].ClipRect;
            draw_list->_TryMergeDrawCmds();
        }
    PopClipRect();
    window->DC.CursorPos = preview_data->BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(window->DC.CursorMaxPos, preview_data->BackupCursorMaxPos);
    window->DC.CursorPosPrevLine = preview_data->BackupCursorPosPrevLine;
    window->DC.PrevLineTextBaseOffset = preview_data->BackupPrevLineTextBaseOffset;
    window->DC.LayoutType = preview_data->BackupLayout;
    window->DC.IsSameLine = false;
    preview_data->PreviewRect = ImRect();
}